

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O0

Value * duckdb::PragmaFunctionExtractor::GetVarArgs(PragmaFunctionCatalogEntry *entry,idx_t offset)

{
  PragmaFunction *in_RDI;
  PragmaFunction fun;
  LogicalType *in_stack_00000468;
  PragmaFunction *type;
  Value *this;
  LogicalTypeId id;
  LogicalType *in_stack_fffffffffffffe80;
  bool local_159;
  element_type *in_stack_fffffffffffffed8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffee0;
  
  this = (Value *)&stack0xfffffffffffffed0;
  type = in_RDI;
  FunctionSet<duckdb::PragmaFunction>::GetFunctionByOffset
            ((FunctionSet<duckdb::PragmaFunction> *)in_RDI,(idx_t)in_RDI);
  id = INVALID;
  local_159 = SimpleFunction::HasVarArgs((SimpleFunction *)0x145eaa6);
  if (local_159) {
    LogicalType::ToString_abi_cxx11_(in_stack_00000468);
    id = SQLNULL;
    Value::Value((Value *)in_stack_fffffffffffffee0._M_pi,(string *)in_stack_fffffffffffffed8);
  }
  else {
    LogicalType::LogicalType(in_stack_fffffffffffffe80,id);
    Value::Value(this,(LogicalType *)type);
  }
  local_159 = !local_159;
  if ((id & SQLNULL) != INVALID) {
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
  }
  if (local_159) {
    LogicalType::~LogicalType((LogicalType *)0x145eb31);
  }
  PragmaFunction::~PragmaFunction(in_RDI);
  return (Value *)type;
}

Assistant:

static Value GetVarArgs(PragmaFunctionCatalogEntry &entry, idx_t offset) {
		auto fun = entry.functions.GetFunctionByOffset(offset);
		return !fun.HasVarArgs() ? Value() : Value(fun.varargs.ToString());
	}